

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O0

int lws_unauthorised_basic_auth(lws *wsi)

{
  int iVar1;
  uchar local_78 [4];
  int n;
  char buf [64];
  uchar *end;
  uchar *p;
  uchar *start;
  lws_context_per_thread *pt;
  lws *wsi_local;
  
  start = (uchar *)(wsi->context->pt + (int)wsi->tsi);
  end = ((lws_context_per_thread *)start)->serv_buf + 0x10;
  buf._56_8_ = ((lws_context_per_thread *)start)->serv_buf + 0x810;
  p = end;
  pt = (lws_context_per_thread *)wsi;
  iVar1 = lws_add_http_header_status(wsi,0x191,&end,(uchar *)buf._56_8_);
  if (iVar1 == 0) {
    iVar1 = lws_snprintf((char *)local_78,0x40,"Basic realm=\"lwsws\"");
    iVar1 = lws_add_http_header_by_token
                      ((lws *)pt,WSI_TOKEN_HTTP_WWW_AUTHENTICATE,local_78,iVar1,&end,
                       (uchar *)buf._56_8_);
    if (iVar1 == 0) {
      iVar1 = lws_add_http_header_content_length((lws *)pt,0,&end,(uchar *)buf._56_8_);
      if (iVar1 == 0) {
        iVar1 = lws_finalize_http_header((lws *)pt,&end,(uchar *)buf._56_8_);
        if (iVar1 == 0) {
          iVar1 = lws_write((lws *)pt,p,(long)end - (long)p,
                            LWS_WRITE_CLIENT_IGNORE_XOR_MASK|LWS_WRITE_HTTP_HEADERS);
          if (iVar1 < 0) {
            wsi_local._4_4_ = -1;
          }
          else {
            wsi_local._4_4_ = lws_http_transaction_completed((lws *)pt);
          }
        }
        else {
          wsi_local._4_4_ = -1;
        }
      }
      else {
        wsi_local._4_4_ = -1;
      }
    }
    else {
      wsi_local._4_4_ = -1;
    }
  }
  else {
    wsi_local._4_4_ = -1;
  }
  return wsi_local._4_4_;
}

Assistant:

int
lws_unauthorised_basic_auth(struct lws *wsi)
{
	struct lws_context_per_thread *pt = &wsi->context->pt[(int)wsi->tsi];
	unsigned char *start = pt->serv_buf + LWS_PRE,
		      *p = start, *end = p + 2048;
	char buf[64];
	int n;

	/* no auth... tell him it is required */

	if (lws_add_http_header_status(wsi, HTTP_STATUS_UNAUTHORIZED, &p, end))
		return -1;

	n = lws_snprintf(buf, sizeof(buf), "Basic realm=\"lwsws\"");
	if (lws_add_http_header_by_token(wsi,
			WSI_TOKEN_HTTP_WWW_AUTHENTICATE,
			(unsigned char *)buf, n, &p, end))
		return -1;

	if (lws_add_http_header_content_length(wsi, 0, &p, end))
		return -1;

	if (lws_finalize_http_header(wsi, &p, end))
		return -1;

	n = lws_write(wsi, start, p - start, LWS_WRITE_HTTP_HEADERS |
					     LWS_WRITE_H2_STREAM_END);
	if (n < 0)
		return -1;

	return lws_http_transaction_completed(wsi);

}